

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void TPZFMatrix<long_double>::PrintStatic
               (longdouble *ptr,int64_t rows,int64_t cols,char *name,ostream *out,
               MatrixOutputFormat form)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  ostream *poVar6;
  void *pvVar7;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ostream *in_R8;
  int in_R9D;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  longdouble val_1;
  int64_t col_2;
  int64_t row_2;
  char number [32];
  longdouble val;
  int64_t col_1;
  int64_t row_1;
  int64_t col;
  int64_t row;
  long local_98;
  long local_90;
  char local_88 [32];
  longdouble local_68;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ostream *local_28;
  char *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R9D == 0) {
    local_20 = in_RCX;
    std::operator<<(in_R8,"Writing matrix \'");
    if (local_20 != (char *)0x0) {
      std::operator<<(local_28,local_20);
    }
    poVar6 = std::operator<<(local_28,"\' (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," x ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
    std::operator<<(poVar6,"):\n");
    for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
      std::operator<<(local_28,"\t");
      for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (local_28,*(longdouble *)
                                      (local_8 + (local_40 * local_10 + local_38) * 0x10));
        std::operator<<(poVar6,"  ");
      }
      std::operator<<(local_28,"\n");
    }
    std::operator<<(local_28,"\n");
  }
  else if (in_R9D == 1) {
    poVar6 = (ostream *)std::ostream::operator<<(in_R8,in_RSI);
    poVar6 = std::operator<<(poVar6," ");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,local_18);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
      for (local_50 = 0; local_50 < local_18; local_50 = local_50 + 1) {
        local_68 = *(longdouble *)(local_8 + (local_50 * local_10 + local_48) * 0x10);
        if ((local_68 != (longdouble)0) || (NAN(local_68) || NAN((longdouble)0))) {
          poVar6 = (ostream *)std::ostream::operator<<(local_28,local_48);
          poVar6 = std::operator<<(poVar6,' ');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_50);
          poVar6 = std::operator<<(poVar6,' ');
          pvVar7 = (void *)std::ostream::operator<<(poVar6,local_68);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::operator<<(local_28,"-1 -1 0.\n");
  }
  else if (in_R9D == 2) {
    poVar6 = std::operator<<(in_R8,in_RCX);
    std::operator<<(poVar6,"\n{ ");
    for (local_90 = 0; local_90 < local_10; local_90 = local_90 + 1) {
      std::operator<<(local_28,"\n{ ");
      __x = extraout_XMM0_Qa;
      for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
        lVar8 = in_ST6;
        std::fabs(__x);
        sprintf(local_88,"%16.16lf",(double)in_ST0);
        std::operator<<(local_28,local_88);
        in_ST0 = in_ST1;
        lVar1 = in_ST2;
        lVar2 = in_ST3;
        lVar3 = in_ST4;
        lVar4 = in_ST5;
        lVar5 = in_ST6;
        __x = extraout_XMM0_Qa_00;
        if (local_98 < local_18 + -1) {
          std::operator<<(local_28,", ");
          in_ST0 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar3 = in_ST4;
          lVar4 = in_ST5;
          lVar5 = in_ST6;
          __x = extraout_XMM0_Qa_01;
        }
        in_ST6 = lVar8;
        in_ST5 = lVar5;
        in_ST4 = lVar4;
        in_ST3 = lVar3;
        in_ST2 = lVar2;
        in_ST1 = lVar1;
        if ((local_98 + 1) % 6 == 0) {
          __x = (double)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
        }
      }
      std::operator<<(local_28," }");
      if (local_90 < local_10 + -1) {
        std::operator<<(local_28,",");
      }
    }
    std::operator<<(local_28," }\n");
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}